

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_fuzz.c
# Opt level: O2

int main(void)

{
  FILE *__stream;
  uint uVar1;
  PaDeviceInfo *pPVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sStackY_70;
  PaStream *stream;
  PaStreamParameters inputParameters;
  PaStreamParameters outputParameters;
  
  uVar1 = Pa_Initialize();
  if (uVar1 == 0) {
    inputParameters.device = Pa_GetDefaultInputDevice();
    if (inputParameters.device == -1) {
      pcVar3 = "Error: No default input device.\n";
      sStackY_70 = 0x20;
    }
    else {
      inputParameters.channelCount = 2;
      inputParameters.sampleFormat = 1;
      pPVar2 = Pa_GetDeviceInfo(inputParameters.device);
      inputParameters.suggestedLatency = pPVar2->defaultLowInputLatency;
      inputParameters.hostApiSpecificStreamInfo = (void *)0x0;
      outputParameters.device = Pa_GetDefaultOutputDevice();
      if (outputParameters.device != -1) {
        outputParameters.channelCount = 2;
        outputParameters.sampleFormat = 1;
        pPVar2 = Pa_GetDeviceInfo(outputParameters.device);
        outputParameters.suggestedLatency = pPVar2->defaultLowOutputLatency;
        outputParameters.hostApiSpecificStreamInfo = (void *)0x0;
        uVar1 = Pa_OpenStream(&stream,&inputParameters,&outputParameters,44100.0,0x40,0,fuzzCallback
                              ,(void *)0x0);
        if ((uVar1 == 0) && (uVar1 = Pa_StartStream(stream), uVar1 == 0)) {
          puts("Hit ENTER to stop program.");
          getchar();
          uVar1 = Pa_CloseStream(stream);
          if (uVar1 == 0) {
            printf("Finished. gNumNoInputs = %d\n",(ulong)(uint)gNumNoInputs);
            Pa_Terminate();
            return 0;
          }
        }
        goto LAB_00106b9a;
      }
      pcVar3 = "Error: No default output device.\n";
      sStackY_70 = 0x21;
    }
    fwrite(pcVar3,sStackY_70,1,_stderr);
    uVar4 = 0;
  }
  else {
LAB_00106b9a:
    uVar4 = (ulong)uVar1;
  }
  Pa_Terminate();
  fwrite("An error occured while using the portaudio stream\n",0x32,1,_stderr);
  fprintf(_stderr,"Error number: %d\n",uVar4);
  __stream = _stderr;
  pcVar3 = Pa_GetErrorText((PaError)uVar4);
  fprintf(__stream,"Error message: %s\n",pcVar3);
  return -1;
}

Assistant:

int main(void)
{
    PaStreamParameters inputParameters, outputParameters;
    PaStream *stream;
    PaError err;

    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    if (inputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default input device.\n");
      goto error;
    }
    inputParameters.channelCount = 2;       /* stereo input */
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = Pa_GetDeviceInfo( inputParameters.device )->defaultLowInputLatency;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default output device.\n");
      goto error;
    }
    outputParameters.channelCount = 2;       /* stereo output */
    outputParameters.sampleFormat = PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              0, /* paClipOff, */  /* we won't output out of range samples so don't bother clipping them */
              fuzzCallback,
              NULL );
    if( err != paNoError ) goto error;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto error;

    printf("Hit ENTER to stop program.\n");
    getchar();
    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;

    printf("Finished. gNumNoInputs = %d\n", gNumNoInputs );
    Pa_Terminate();
    return 0;

error:
    Pa_Terminate();
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return -1;
}